

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_compute_qdelta_by_rate
              (AV1_COMP *cpi,FRAME_TYPE frame_type,int qindex,double rate_target_ratio)

{
  int iVar1;
  AV1_COMP *cpi_00;
  int in_EDX;
  long in_RDI;
  double in_XMM0_Qa;
  int target_index;
  int target_bits_per_mb;
  int base_bits_per_mb;
  RATE_CONTROL *rc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x60770);
  iVar1 = av1_rc_bits_per_mb((AV1_COMP *)rate_target_ratio,rc._7_1_,(int)rc,_target_bits_per_mb,
                             target_index);
  iVar1 = find_qindex_by_rate(cpi_00,iVar1,
                              (FRAME_TYPE)((uint)(int)(in_XMM0_Qa * (double)iVar1) >> 0x18),
                              in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return iVar1 - in_EDX;
}

Assistant:

int av1_compute_qdelta_by_rate(const AV1_COMP *cpi, FRAME_TYPE frame_type,
                               int qindex, double rate_target_ratio) {
  const RATE_CONTROL *rc = &cpi->rc;

  // Look up the current projected bits per block for the base index
  const int base_bits_per_mb =
      av1_rc_bits_per_mb(cpi, frame_type, qindex, 1.0, 0);

  // Find the target bits per mb based on the base value and given ratio.
  const int target_bits_per_mb = (int)(rate_target_ratio * base_bits_per_mb);

  const int target_index = find_qindex_by_rate(
      cpi, target_bits_per_mb, frame_type, rc->best_quality, rc->worst_quality);
  return target_index - qindex;
}